

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O0

void G_LeavingHub(int mode,cluster_info_t *cluster,wbstartstruct_t *wbs)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FHubInfo *pFVar5;
  char *pcVar6;
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  wbstartstruct_t *wbs_local;
  cluster_info_t *cluster_local;
  int mode_local;
  
  if ((cluster->flags & 1U) != 0) {
    for (local_24 = 0; uVar3 = TArray<FHubInfo,_FHubInfo>::Size(&hubdata), local_24 < uVar3;
        local_24 = local_24 + 1) {
      pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
      if (pFVar5->finished_ep == level.levelnum) {
        pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
        FHubInfo::operator=(pFVar5,wbs);
        break;
      }
    }
    uVar3 = TArray<FHubInfo,_FHubInfo>::Size(&hubdata);
    if (local_24 == uVar3) {
      uVar3 = TArray<FHubInfo,_FHubInfo>::Reserve(&hubdata,1);
      pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)uVar3);
      FHubInfo::operator=(pFVar5,wbs);
    }
    iVar1 = level.levelnum;
    pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
    pFVar5->finished_ep = iVar1;
    if (((multiplayer & 1U) == 0) &&
       (iVar4 = FIntCVar::operator_cast_to_int(&deathmatch), iVar1 = level.killed_monsters,
       iVar4 == 0)) {
      pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
      pFVar5->plyr[0].skills = iVar1;
      iVar1 = level.found_items;
      pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
      pFVar5->plyr[0].sitems = iVar1;
      iVar1 = level.found_secrets;
      pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
      pFVar5->plyr[0].ssecret = iVar1;
    }
    if (mode != 0) {
      wbs->maxsecret = 0;
      wbs->maxitems = 0;
      wbs->maxkills = 0;
      for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
        wbs->plyr[local_24].ssecret = 0;
        wbs->plyr[local_24].skills = 0;
        wbs->plyr[local_24].sitems = 0;
      }
      for (local_24 = 0; uVar3 = TArray<FHubInfo,_FHubInfo>::Size(&hubdata), local_24 < uVar3;
          local_24 = local_24 + 1) {
        pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
        wbs->maxkills = pFVar5->maxkills + wbs->maxkills;
        pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
        wbs->maxitems = pFVar5->maxitems + wbs->maxitems;
        pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
        wbs->maxsecret = pFVar5->maxsecret + wbs->maxsecret;
        for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
          pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
          wbs->plyr[local_28].sitems = pFVar5->plyr[local_28].sitems + wbs->plyr[local_28].sitems;
          pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
          wbs->plyr[local_28].skills = pFVar5->plyr[local_28].skills + wbs->plyr[local_28].skills;
          pFVar5 = TArray<FHubInfo,_FHubInfo>::operator[](&hubdata,(ulong)local_24);
          wbs->plyr[local_28].ssecret = pFVar5->plyr[local_28].ssecret + wbs->plyr[local_28].ssecret
          ;
        }
      }
      bVar2 = FString::IsNotEmpty(&cluster->ClusterName);
      if (bVar2) {
        if ((cluster->flags & 0x40U) == 0) {
          FString::operator=(&level.LevelName,&cluster->ClusterName);
        }
        else {
          pcVar6 = FString::operator_cast_to_char_(&cluster->ClusterName);
          pcVar6 = FStringTable::operator()(&GStrings,pcVar6);
          FString::operator=(&level.LevelName,pcVar6);
        }
      }
    }
  }
  if (mode != 0) {
    TArray<FHubInfo,_FHubInfo>::Clear(&hubdata);
  }
  return;
}

Assistant:

void G_LeavingHub(int mode, cluster_info_t * cluster, wbstartstruct_t * wbs)
{
	unsigned int i,j;

	if (cluster->flags & CLUSTER_HUB)
	{
		for(i=0;i<hubdata.Size();i++)
		{
			if (hubdata[i].finished_ep==level.levelnum)
			{
				hubdata[i]=*wbs;
				break;
			}
		}
		if (i==hubdata.Size())
		{
			hubdata[hubdata.Reserve(1)] = *wbs;
		}

		hubdata[i].finished_ep=level.levelnum;
		if (!multiplayer && !deathmatch)
		{
			// The player counters don't work in hubs
			hubdata[i].plyr[0].skills=level.killed_monsters;
			hubdata[i].plyr[0].sitems=level.found_items;
			hubdata[i].plyr[0].ssecret=level.found_secrets;
		}


		if (mode!=FINISH_SameHub)
		{
			wbs->maxkills=wbs->maxitems=wbs->maxsecret=0;
			for(i=0;i<MAXPLAYERS;i++)
			{
				wbs->plyr[i].sitems=wbs->plyr[i].skills=wbs->plyr[i].ssecret=0;
			}

			for(i=0;i<hubdata.Size();i++)
			{
				wbs->maxkills += hubdata[i].maxkills;
				wbs->maxitems += hubdata[i].maxitems;
				wbs->maxsecret += hubdata[i].maxsecret;
				for(j=0;j<MAXPLAYERS;j++)
				{
					wbs->plyr[j].sitems += hubdata[i].plyr[j].sitems;
					wbs->plyr[j].skills += hubdata[i].plyr[j].skills;
					wbs->plyr[j].ssecret += hubdata[i].plyr[j].ssecret;
				}
			}
			if (cluster->ClusterName.IsNotEmpty()) 
			{
				if (cluster->flags & CLUSTER_LOOKUPNAME)
				{
					level.LevelName = GStrings(cluster->ClusterName);
				}
				else
				{
					level.LevelName = cluster->ClusterName;
				}
			}
		}
	}
	if (mode!=FINISH_SameHub) hubdata.Clear();
}